

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O1

int secp256k1_der_parse_integer(secp256k1_scalar *r,uchar **sig,uchar *sigend)

{
  uchar uVar1;
  uchar *puVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong __n;
  int overflow;
  uchar ra [32];
  int local_4c;
  uchar local_48 [32];
  
  local_4c = 0;
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[0x18] = '\0';
  local_48[0x19] = '\0';
  local_48[0x1a] = '\0';
  local_48[0x1b] = '\0';
  local_48[0x1c] = '\0';
  local_48[0x1d] = '\0';
  local_48[0x1e] = '\0';
  local_48[0x1f] = '\0';
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  puVar2 = *sig;
  iVar7 = 0;
  iVar8 = 0;
  if ((puVar2 != sigend) && (iVar8 = iVar7, *puVar2 == '\x02')) {
    *sig = puVar2 + 1;
    uVar4 = secp256k1_der_read_len(sig,sigend);
    if ((((0 < (int)uVar4) && (puVar2 = *sig, puVar2 + uVar4 <= sigend)) &&
        ((uVar1 = *puVar2, uVar4 == 1 || uVar1 != '\0' || ((char)puVar2[1] < '\0')))) &&
       ((uVar1 != 0xff || uVar4 == 1 || (-1 < (char)puVar2[1])))) {
      if ((char)uVar1 < '\0') {
        local_4c = 1;
      }
      uVar6 = 1;
      if ((int)uVar4 < 1) {
        uVar6 = uVar4;
      }
      puVar2 = *sig;
      do {
        uVar5 = uVar4;
        if (*puVar2 != '\0') break;
        *sig = puVar2 + 1;
        bVar3 = 1 < (int)uVar4;
        uVar5 = uVar6 - 1;
        uVar4 = uVar4 - 1;
        puVar2 = puVar2 + 1;
      } while (bVar3);
      if (0x20 < (int)uVar5) {
        local_4c = 1;
      }
      __n = (ulong)uVar5;
      if (local_4c == 0) {
        memcpy(&stack0xffffffffffffffd8 + -__n,*sig,__n);
        secp256k1_scalar_set_b32(r,local_48,&local_4c);
      }
      if (local_4c != 0) {
        r->d[2] = 0;
        r->d[3] = 0;
        r->d[0] = 0;
        r->d[1] = 0;
      }
      *sig = *sig + __n;
      iVar8 = 1;
    }
  }
  return iVar8;
}

Assistant:

static int secp256k1_der_parse_integer(secp256k1_scalar *r, const unsigned char **sig, const unsigned char *sigend) {
    int overflow = 0;
    unsigned char ra[32] = {0};
    int rlen;

    if (*sig == sigend || **sig != 0x02) {
        /* Not a primitive integer (X.690-0207 8.3.1). */
        return 0;
    }
    (*sig)++;
    rlen = secp256k1_der_read_len(sig, sigend);
    if (rlen <= 0 || (*sig) + rlen > sigend) {
        /* Exceeds bounds or not at least length 1 (X.690-0207 8.3.1).  */
        return 0;
    }
    if (**sig == 0x00 && rlen > 1 && (((*sig)[1]) & 0x80) == 0x00) {
        /* Excessive 0x00 padding. */
        return 0;
    }
    if (**sig == 0xFF && rlen > 1 && (((*sig)[1]) & 0x80) == 0x80) {
        /* Excessive 0xFF padding. */
        return 0;
    }
    if ((**sig & 0x80) == 0x80) {
        /* Negative. */
        overflow = 1;
    }
    while (rlen > 0 && **sig == 0) {
        /* Skip leading zero bytes */
        rlen--;
        (*sig)++;
    }
    if (rlen > 32) {
        overflow = 1;
    }
    if (!overflow) {
        memcpy(ra + 32 - rlen, *sig, rlen);
        secp256k1_scalar_set_b32(r, ra, &overflow);
    }
    if (overflow) {
        secp256k1_scalar_set_int(r, 0);
    }
    (*sig) += rlen;
    return 1;
}